

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboteqInterface.cpp
# Opt level: O3

void * RoboteqInterfaceThread(void *pParam)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *__s;
  char *__s_00;
  timespec local_40;
  
  if ((szRoboteqInterfacePath[0] == ':') && (iVar3 = atoi(szRoboteqInterfacePath + 1), 0 < iVar3)) {
    RoboteqInterfacePseudoRS232Port.DevType = 2;
    do {
      iVar3 = LaunchMultiCliTCPSrv(szRoboteqInterfacePath + 1,handleroboteqinterfacecli,(void *)0x0)
      ;
      if (iVar3 == 0) goto LAB_00195ba7;
      puts("Error launching the RoboteqInterface server.");
      local_40.tv_sec = 4;
      local_40.tv_nsec = 0;
      nanosleep(&local_40,(timespec *)0x0);
    } while (bExit == 0);
  }
  else {
    bVar1 = false;
    __s = "RoboteqInterface disconnection failed.";
    do {
      if (bVar1) {
        iVar3 = handleroboteqinterface(&RoboteqInterfacePseudoRS232Port);
        if (iVar3 == 0) {
          bVar1 = true;
          bVar2 = false;
        }
        else {
          puts("Connection to a RoboteqInterface lost.");
          iVar3 = CloseRS232Port(&RoboteqInterfacePseudoRS232Port);
          __s_00 = "RoboteqInterface disconnection failed.";
          if (iVar3 == 0) {
            __s_00 = "RoboteqInterface disconnected.";
          }
          puts(__s_00);
          local_40.tv_sec = 0;
          local_40.tv_nsec = 50000000;
LAB_00195b2e:
          bVar1 = false;
          nanosleep(&local_40,(timespec *)0x0);
          bVar2 = true;
        }
      }
      else {
        iVar3 = connectroboteqinterface(&RoboteqInterfacePseudoRS232Port);
        if (iVar3 != 0) {
          local_40.tv_sec = 1;
          local_40.tv_nsec = 0;
          goto LAB_00195b2e;
        }
        bVar2 = false;
        local_40.tv_sec = 0;
        local_40.tv_nsec = 50000000;
        nanosleep(&local_40,(timespec *)0x0);
        roboteq_u1 = 0.0;
        roboteq_u2 = 0.0;
        bVar1 = true;
      }
    } while (bExit == 0);
    if (!bVar2) {
      iVar3 = CloseRS232Port(&RoboteqInterfacePseudoRS232Port);
      if (iVar3 == 0) {
        __s = "RoboteqInterface disconnected.";
      }
      puts(__s);
LAB_00195ba7:
      if (bExit == 0) {
        bExit = 1;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE RoboteqInterfaceThread(void* pParam)
{
	//CHRONO chrono;
	//double dt = 0, t = 0, t0 = 0;
	//struct timeval tv;

	UNREFERENCED_PARAMETER(pParam);

	//EnterCriticalSection(&strtimeCS);
	//sprintf(roboteqinterfacefilename, LOG_FOLDER"roboteqinterface_%.64s.txt", strtimeex_fns());
	//LeaveCriticalSection(&strtimeCS);
	//roboteqinterfacefile = fopen(roboteqinterfacefilename, "w");
	//if (roboteqinterfacefile == NULL)
	//{
	//	printf("Unable to create roboteqinterface file.\n");
	//	if (!bExit) bExit = TRUE; // Unexpected program exit...
	//	return 0;
	//}

	// Try to determine whether it is a server TCP port.
	if ((szRoboteqInterfacePath[0] == ':')&&(atoi(szRoboteqInterfacePath+1) > 0))
	{
		RoboteqInterfacePseudoRS232Port.DevType = TCP_SERVER_TYPE_RS232PORT;
		while (LaunchMultiCliTCPSrv(szRoboteqInterfacePath+1, handleroboteqinterfacecli, NULL) != EXIT_SUCCESS)
		{
			printf("Error launching the RoboteqInterface server.\n");
			mSleep(4000);
			if (bExit) break;
		}
	}
	else
	{
		BOOL bConnected = FALSE;

		//t = 0;

		//StartChrono(&chrono);

		for (;;)
		{
			//uSleep(1000*50);
			//t0 = t;
			//GetTimeElapsedChrono(&chrono, &t);
			//dt = t-t0;

			//printf("RoboteqInterfaceThread period : %f s.\n", dt);

			if (!bConnected)
			{
				if (connectroboteqinterface(&RoboteqInterfacePseudoRS232Port) == EXIT_SUCCESS) 
				{
					uSleep(1000*50);
					bConnected = TRUE; 

					inithandleroboteqinterface(&RoboteqInterfacePseudoRS232Port);
				}
				else 
				{
					bConnected = FALSE;
					mSleep(1000);
				}
			}
			else
			{
				//// Time...
				//if (gettimeofday(&tv, NULL) != EXIT_SUCCESS)
				//{
				//	tv.tv_sec = 0;
				//	tv.tv_usec = 0;
				//}

				if (handleroboteqinterface(&RoboteqInterfacePseudoRS232Port) != EXIT_SUCCESS)
				{
					printf("Connection to a RoboteqInterface lost.\n");
					bConnected = FALSE;
					disconnectroboteqinterface(&RoboteqInterfacePseudoRS232Port);
					uSleep(1000*50);
				}
			}

			if (bExit) break;
		}

		//StopChrono(&chrono, &t);

		if (bConnected) disconnectroboteqinterface(&RoboteqInterfacePseudoRS232Port);
	}

	//fclose(roboteqinterfacefile);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}